

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandSymFun(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nVars_00;
  size_t sVar2;
  word *Sign;
  char *__s;
  char *pcVar3;
  int local_60;
  uint local_58;
  uint local_54;
  int fVerbose;
  int nVars;
  int k;
  int c;
  char *pCommand;
  char *pTruth;
  char *pStr;
  word *pFun;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_54 = 0xffffffff;
  local_58 = 0;
  Extra_UtilGetoptReset();
LAB_0028d560:
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"Nvh");
    if (iVar1 == -1) {
      if (local_54 == 0xffffffff) {
        if (argc == globalUtilOptind + 1) {
          pcVar3 = argv[globalUtilOptind];
          sVar2 = strlen(pcVar3);
          nVars_00 = (int)sVar2 - 1;
          for (fVerbose = 0;
              (fVerbose <= (int)nVars_00 && ((pcVar3[fVerbose] == '0' || (pcVar3[fVerbose] == '1')))
              ); fVerbose = fVerbose + 1) {
          }
          if ((int)nVars_00 < fVerbose) {
            Sign = Abc_TtSymFunGenerate(pcVar3,nVars_00);
            if ((int)nVars_00 < 3) {
              local_60 = 2;
            }
            else {
              local_60 = (1 << ((char)nVars_00 - 2U & 0x1f)) + 1;
            }
            pcVar3 = (char *)calloc((long)local_60,1);
            Extra_PrintHexadecimalString(pcVar3,(uint *)Sign,nVars_00);
            if (Sign != (word *)0x0) {
              free(Sign);
            }
            if (local_58 == 0) {
              if ((int)nVars_00 < 9) {
                printf("%s\n",pcVar3);
              }
            }
            else if ((int)nVars_00 < 7) {
              printf("Generated truth table of the %d-variable function (%s) and set it as the current network\n"
                     ,(ulong)nVars_00,pcVar3);
            }
            else {
              printf("Generated truth table of the %d-variable function and set it as the current network.\n"
                     ,(ulong)nVars_00);
            }
            sVar2 = strlen(pcVar3);
            __s = (char *)calloc(sVar2 + 100,1);
            sprintf(__s,"read_truth %s",pcVar3);
            Cmd_CommandExecute(pAbc,__s);
            if (__s != (char *)0x0) {
              free(__s);
            }
            if (pcVar3 != (char *)0x0) {
              free(pcVar3);
            }
            pAbc_local._4_4_ = 0;
          }
          else {
            Abc_Print(-1,"The string should be composed of zeros and ones.\n");
            pAbc_local._4_4_ = 1;
          }
        }
        else {
          Abc_Print(-1,"Not enough command-line arguments.\n");
          pAbc_local._4_4_ = 1;
        }
      }
      else if (((int)local_54 < 1) || (0x10 < (int)local_54)) {
        printf("Cannot generate functions for less than 1 and more than %d variables.\n",
               (ulong)local_54);
        pAbc_local._4_4_ = 1;
      }
      else {
        Ntk_SymFunGenerate(local_54,local_58);
        pAbc_local._4_4_ = 0;
      }
      return pAbc_local._4_4_;
    }
    if (iVar1 != 0x4e) break;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by a file name.\n");
      goto LAB_0028d873;
    }
    local_54 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  }
  if (iVar1 != 0x68) {
    if (iVar1 == 0x76) {
      local_58 = local_58 ^ 1;
      goto LAB_0028d560;
    }
    Abc_Print(-2,"Unknown switch.\n");
  }
LAB_0028d873:
  Abc_Print(-2,"usage: symfun [-N num] [-vh] <ones>\n");
  Abc_Print(-2,"\t           generated a single-output symmetric function\n");
  Abc_Print(-2,
            "\t-N <num> : prints truth tables of all N-var symmetric functions [default = not used]\n"
           );
  pcVar3 = "no";
  if (local_58 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v       : toggle verbose output [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  Abc_Print(-2,"\t<ones>   : the string of N+1 zeros and ones, where N is the number of variables\n"
           );
  Abc_Print(-2,"\t           For example, to get 3-input NAND-gate, use \"symfun 1000\".\n");
  Abc_Print(-2,"\t           To get 5-input majority gate, use \"symfun 000111\".\n");
  return 1;
}

Assistant:

int Abc_CommandSymFun( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Ntk_SymFunGenerate( int nVars, int fVerbose );
    word * pFun = NULL;
    char * pStr,  * pTruth, * pCommand;
    int c, k, nVars = -1, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a file name.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    if ( nVars != -1 )
    {
        if ( nVars < 1 || nVars > 16 )
        {
            printf( "Cannot generate functions for less than 1 and more than %d variables.\n", nVars );
            return 1;
        }
        Ntk_SymFunGenerate( nVars, fVerbose );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Not enough command-line arguments.\n" );
        return 1;
    }
    // make sure the string is composed of N+1 zeros and ones
    pStr = argv[globalUtilOptind];
    nVars = strlen(pStr) - 1;
    for ( k = 0; k <= nVars; k++ )
        if ( pStr[k] != '0' && pStr[k] != '1' )
            break;
    if ( k <= nVars )
    {
        Abc_Print( -1, "The string should be composed of zeros and ones.\n" );
        return 1;
    }
    // generate and print one function
    pFun = Abc_TtSymFunGenerate( pStr, nVars );
    pTruth = ABC_CALLOC( char, nVars > 2 ? (1 << (nVars-2)) + 1 : 2 );
    Extra_PrintHexadecimalString( pTruth, (unsigned *)pFun, nVars );
    ABC_FREE( pFun );
    if ( fVerbose )
    {
        if ( nVars > 6 )
            printf( "Generated truth table of the %d-variable function and set it as the current network.\n", nVars );
        else
            printf( "Generated truth table of the %d-variable function (%s) and set it as the current network\n", nVars, pTruth );
    }
    else if ( nVars <= 8 )
        printf( "%s\n", pTruth );
    // read the truth table to be the current network in ABC
    pCommand = ABC_CALLOC( char, strlen(pTruth) + 100 );
    sprintf( pCommand, "read_truth %s", pTruth );
    Cmd_CommandExecute( pAbc, pCommand );
    ABC_FREE( pCommand );
    ABC_FREE( pTruth );
    return 0;

usage:
    Abc_Print( -2, "usage: symfun [-N num] [-vh] <ones>\n" );
    Abc_Print( -2, "\t           generated a single-output symmetric function\n" );
    Abc_Print( -2, "\t-N <num> : prints truth tables of all N-var symmetric functions [default = not used]\n" );
    Abc_Print( -2, "\t-v       : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    Abc_Print( -2, "\t<ones>   : the string of N+1 zeros and ones, where N is the number of variables\n" );
    Abc_Print( -2, "\t           For example, to get 3-input NAND-gate, use \"symfun 1000\".\n" );
    Abc_Print( -2, "\t           To get 5-input majority gate, use \"symfun 000111\".\n" );

    return 1;
}